

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O3

bool __thiscall
Shell::AnswerLiteralManager::tryGetAnswer
          (AnswerLiteralManager *this,Clause *refutation,Stack<Kernel::Clause_*> *answer)

{
  bool bVar1;
  Unit *pUVar2;
  bool bVar3;
  Inference *inf;
  Iterator it2;
  Iterator it;
  anon_union_8_2_756040a0_for_Iterator_0 local_40;
  anon_union_8_2_756040a0_for_Iterator_0 local_38;
  
  inf = &(refutation->super_Unit)._inference;
  bVar1 = pushFirstPremiseToAnswerIfFromResolver(inf,answer);
  bVar3 = true;
  if (!bVar1) {
    if ((refutation->super_Unit)._inference.field_0x1 == -0x7a) {
      local_38 = (anon_union_8_2_756040a0_for_Iterator_0)Kernel::Inference::iterator(inf);
      bVar1 = Kernel::Inference::hasNext(inf,(Iterator *)&local_38);
      bVar3 = false;
      if (bVar1) {
        do {
          pUVar2 = Kernel::Inference::next(inf,(Iterator *)&local_38);
          if ((pUVar2->_inference).field_0x1 == -0x77) {
            local_40 = (anon_union_8_2_756040a0_for_Iterator_0)
                       Kernel::Inference::iterator(&pUVar2->_inference);
            pUVar2 = Kernel::Inference::next(&pUVar2->_inference,(Iterator *)&local_40);
            bVar1 = pushFirstPremiseToAnswerIfFromResolver(&pUVar2->_inference,answer);
            bVar3 = (bool)(bVar3 | bVar1);
          }
          bVar1 = Kernel::Inference::hasNext(inf,(Iterator *)&local_38);
        } while (bVar1);
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool AnswerLiteralManager::tryGetAnswer(Clause* refutation, Stack<Clause*>& answer)
{
  ASS(refutation->isEmpty());

  Inference& inf = refutation->inference();
  if (pushFirstPremiseToAnswerIfFromResolver(inf,answer)) {
    return true;
  } else if (inf.rule() == InferenceRule::AVATAR_REFUTATION) {
    bool added = false;
    auto it = inf.iterator();
    while (inf.hasNext(it)) {
      Unit* prem = inf.next(it);
      Inference& inf2 = prem->inference();
      if (inf2.rule() == InferenceRule::AVATAR_CONTRADICTION_CLAUSE) {
        auto it2 = inf2.iterator();
        Unit* anEmpty = inf2.next(it2);
        ASS(!inf2.hasNext(it2));
        Inference& inf3 = anEmpty->inference();
        added |= pushFirstPremiseToAnswerIfFromResolver(inf3,answer);
      }
    }
    return added;
  }
  // currently does nothing for AVATAR_REFUTATION_SMT (which does not get minimized)

  return false;
}